

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O2

int rfft2b_(int *ldim,int *l,int *m,double *r__,double *wsave,int *lensav,double *work,int *lenwrk,
           int *ier)

{
  uint uVar1;
  int *jump;
  double *pdVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  int iVar14;
  double dVar15;
  int ier1;
  int local_94;
  int *local_90;
  int mmsav;
  double *local_80;
  ulong local_78;
  int mwsav;
  int ldw;
  int ldh;
  int local_64;
  ulong local_60;
  double *local_58;
  double *local_50;
  double *local_48;
  ulong local_40;
  int i__3;
  
  local_78 = (ulong)*ldim;
  *ier = 0;
  iVar7 = *l;
  local_90 = ldim;
  local_80 = r__;
  local_58 = wsave;
  dVar15 = log((double)iVar7);
  iVar7 = (int)(dVar15 / 0.6931471805599453) + iVar7;
  iVar5 = *m;
  dVar15 = log((double)iVar5);
  iVar14 = (int)(dVar15 / 0.6931471805599453) + iVar5 * 2 + 4;
  iVar5 = *m;
  mwsav = iVar14;
  dVar15 = log((double)iVar5);
  uVar3 = local_78;
  pdVar2 = local_80;
  mmsav = (int)(dVar15 / 0.6931471805599453) + iVar5 + 4;
  iVar5 = iVar7 + iVar14 + 4;
  if (*lensav < mmsav + iVar5) {
    iVar7 = 2;
  }
  else {
    uVar1 = *l;
    local_40 = (ulong)uVar1;
    iVar14 = *m;
    if (*lenwrk < (int)((uVar1 + 1) * iVar14)) {
      iVar7 = 3;
    }
    else {
      local_94 = *local_90;
      if (local_94 < (int)uVar1) {
        iVar7 = 5;
      }
      else {
        uVar9 = ~local_78;
        local_48 = local_58 + -1;
        pdVar6 = local_80 + uVar9 + local_78 * 2 + 1;
        for (lVar10 = 2; lVar10 < ((iVar14 + 1) / 2) * 2; lVar10 = lVar10 + 1) {
          *pdVar6 = *pdVar6 + *pdVar6;
          pdVar6 = pdVar6 + local_78;
        }
        pdVar6 = local_80 + uVar9 + local_78 * 3 + 1;
        for (lVar10 = 3; lVar10 <= iVar14; lVar10 = lVar10 + 2) {
          *pdVar6 = -*pdVar6;
          pdVar6 = pdVar6 + local_78 * 2;
        }
        local_94 = local_94 * iVar14;
        local_50 = local_48 + (long)iVar5 + 1;
        local_60 = uVar9;
        rfftmb_(&c__1,&c__1,m,local_90,local_80,&local_94,local_50,&mmsav,work,lenwrk,&ier1);
        iVar5 = (*l + 1) / 2;
        ldh = iVar5;
        if (2 < *l) {
          ldw = iVar5 * 2;
          r2w_(local_90,&ldw,l,m,pdVar2,work);
          pdVar6 = local_80;
          local_94 = iVar5 + -1;
          local_64 = iVar5 * *m;
          i__3 = *m * *l;
          cfftmb_(&local_94,&c__1,m,&ldh,(fft_complex_t *)(work + 1),&local_64,
                  local_48 + (long)iVar7 + 5,&mwsav,local_80,&i__3,&ier1);
          if (ier1 != 0) {
            iVar7 = 0x14;
            goto LAB_0012f5b4;
          }
          w2r_(local_90,&ldw,l,m,pdVar6,work);
        }
        uVar8 = local_78;
        if ((local_40 & 1) == 0) {
          local_94 = *m;
          iVar4 = (local_94 + 1) / 2;
          iVar5 = (int)local_78;
          iVar14 = iVar5 * 2;
          for (iVar7 = 2; SBORROW4(iVar7,iVar4 * 2) != iVar7 + iVar4 * -2 < 0; iVar7 = iVar7 + 1) {
            pdVar2[uVar9 + (long)(*l + iVar14)] =
                 pdVar2[uVar9 + (long)(*l + iVar14)] + pdVar2[uVar9 + (long)(*l + iVar14)];
            iVar14 = iVar14 + iVar5;
          }
          iVar14 = iVar5 * 3;
          for (iVar7 = 3; iVar7 <= local_94; iVar7 = iVar7 + 2) {
            pdVar2[uVar9 + (long)(*l + iVar14)] = -pdVar2[uVar9 + (long)(*l + iVar14)];
            iVar14 = iVar14 + iVar5 * 2;
          }
          local_94 = local_94 * *local_90;
          rfftmb_(&c__1,&c__1,m,local_90,pdVar2 + uVar9 + (long)*l + local_78,&local_94,local_50,
                  &mmsav,work,lenwrk,&ier1);
        }
        pdVar2 = local_80;
        jump = local_90;
        iVar7 = *l;
        lVar10 = (long)(((iVar7 + 1) / 2) * 2);
        uVar1 = *m;
        uVar9 = 0;
        if (0 < (int)uVar1) {
          uVar9 = (ulong)uVar1;
        }
        pdVar6 = local_80 + uVar8 + local_60 + 2;
        for (lVar11 = 2; pdVar12 = pdVar6, uVar13 = uVar9, lVar11 < lVar10; lVar11 = lVar11 + 1) {
          while (uVar13 != 0) {
            *pdVar12 = *pdVar12 + *pdVar12;
            pdVar12 = pdVar12 + uVar3;
            uVar13 = uVar13 - 1;
          }
          pdVar6 = pdVar6 + 1;
        }
        pdVar6 = local_80 + uVar8 + local_60;
        for (uVar8 = 1; lVar11 = 3, uVar8 != (int)uVar9 + 1; uVar8 = uVar8 + 1) {
          for (; lVar11 < lVar10; lVar11 = lVar11 + 2) {
            pdVar6[lVar11] = -pdVar6[lVar11];
          }
          pdVar6 = pdVar6 + uVar3;
        }
        local_94 = uVar1 * *local_90;
        dVar15 = log((double)iVar7);
        local_64 = (int)(dVar15 / 0.6931471805599453) + iVar7 + 4;
        rfftmb_(m,jump,l,&c__1,pdVar2,&local_94,local_58,&local_64,work,lenwrk,&ier1);
        iVar7 = 0x14;
        if (ier1 == 0) {
          return 0;
        }
      }
    }
  }
LAB_0012f5b4:
  *ier = iVar7;
  return 0;
}

Assistant:

int rfft2b_(int *ldim, int *l, int *m, fft_real_t *r__,
	 fft_real_t *wsave, int *lensav, fft_real_t *work, int *lenwrk, int *
	ier)
{
    /* System generated locals */
    int r_dim1, r_offset, i__1, i__2, i__3;

    /* Builtin functions */


    /* Local variables */
     int i__, j;
    extern /* Subroutine */ int r2w_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *), w2r_(int *, int *, int *, int
	    *, fft_real_t *, fft_real_t *);
     int ldh, ldw, ldx, ier1, modl, modm, mmsav, lwsav, mwsav;
    extern /* Subroutine */ int cfftmb_(), rfftmb_(int *, int *,
	    int *, int *, fft_real_t *, int *, fft_real_t *, int *, fft_real_t *
	    , int *, int *), xerfft_(char *, int *, ftnlen);



/* INITIALIZE IER */

    /* Parameter adjustments */
    r_dim1 = *ldim;
    r_offset = 1 + r_dim1;
    r__ -= r_offset;
    --wsave;
    --work;

    /* Function Body */
    *ier = 0;

/* VERIFY LENSAV */

    lwsav = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    mwsav = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    mmsav = *m + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    modl = *l % 2;
    modm = *m % 2;

    if (*lensav < lwsav + mwsav + mmsav) {
	*ier = 2;
	//xerfft_("RFFT2F", &c__6, (ftnlen)6);
	goto L100;
    }

/* VERIFY LENWRK */

    if (*lenwrk < (*l + 1) * *m) {
	*ier = 3;
	//xerfft_("RFFT2F", &c__8, (ftnlen)6);
	goto L100;
    }

/* VERIFY LDIM IS AS BIG AS L */

    if (*ldim < *l) {
	*ier = 5;
	//xerfft_("RFFT2F", &c_n6, (ftnlen)6);
	goto L100;
    }

/* TRANSFORM SECOND DIMENSION OF ARRAY */

    i__1 = ((*m + 1) / 2 << 1) - 1;
    for (j = 2; j <= i__1; ++j) {
	r__[j * r_dim1 + 1] += r__[j * r_dim1 + 1];
    }
    i__1 = *m;
    for (j = 3; j <= i__1; j += 2) {
	r__[j * r_dim1 + 1] = -r__[j * r_dim1 + 1];
    }
    i__1 = *m * *ldim;
    rfftmb_(&c__1, &c__1, m, ldim, &r__[r_offset], &i__1, &wsave[lwsav +
	    mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    ldh = (*l + 1) / 2;
    if (ldh > 1) {
	ldw = ldh + ldh;

/*     R AND WORK ARE SWITCHED BECAUSE THE THE FIRST DIMENSION */
/*     OF THE INPUT TO COMPLEX CFFTMF MUST BE EVEN. */

	r2w_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
	i__1 = ldh - 1;
	i__2 = ldh * *m;
	i__3 = *l * *m;
	cfftmb_(&i__1, &c__1, m, &ldh, (complex*)&work[2], &i__2, &wsave[lwsav + 1], &
		mwsav, &r__[r_offset], &i__3, &ier1);
	if (ier1 != 0) {
	    *ier = 20;
	    //xerfft_("RFFT2B", &c_n5, (ftnlen)6);
	    goto L100;
	}
	w2r_(ldim, &ldw, l, m, &r__[r_offset], &work[1]);
    }

    if (modl == 0) {
	i__1 = ((*m + 1) / 2 << 1) - 1;
	for (j = 2; j <= i__1; ++j) {
	    r__[*l + j * r_dim1] += r__[*l + j * r_dim1];
	}
	i__1 = *m;
	for (j = 3; j <= i__1; j += 2) {
	    r__[*l + j * r_dim1] = -r__[*l + j * r_dim1];
	}
	i__1 = *m * *ldim;
	rfftmb_(&c__1, &c__1, m, ldim, &r__[*l + r_dim1], &i__1, &wsave[lwsav
		+ mwsav + 1], &mmsav, &work[1], lenwrk, &ier1);
    }

/*     PRINT*, 'BACKWARD TRANSFORM IN THE J DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

/* TRANSFORM FIRST DIMENSION OF ARRAY */

    ldx = ((*l + 1) / 2 << 1) - 1;
    i__1 = ldx;
    for (i__ = 2; i__ <= i__1; ++i__) {
	i__2 = *m;
	for (j = 1; j <= i__2; ++j) {
	    r__[i__ + j * r_dim1] += r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m;
    for (j = 1; j <= i__1; ++j) {
	i__2 = ldx;
	for (i__ = 3; i__ <= i__2; i__ += 2) {
	    r__[i__ + j * r_dim1] = -r__[i__ + j * r_dim1];
	}
    }
    i__1 = *m * *ldim;
    i__2 = *l + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    rfftmb_(m, ldim, l, &c__1, &r__[r_offset], &i__1, &wsave[1], &i__2, &work[
	    1], lenwrk, &ier1);


/*     PRINT*, 'BACKWARD TRANSFORM IN THE I DIRECTION' */
/*     DO I=1,L */
/*       PRINT*, (R(I,J),J=1,M) */
/*     END DO */

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("RFFT2F", &c_n5, (ftnlen)6);
	goto L100;
    }

L100:

    return 0;
}